

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiplexEpoll.cpp
# Opt level: O1

void __thiscall higan::MultiplexEpoll::MultiplexEpoll(MultiplexEpoll *this)

{
  int iVar1;
  value_type *__val;
  pointer peVar2;
  long lVar3;
  
  MultiplexBase::MultiplexBase(&this->super_MultiplexBase);
  (this->super_MultiplexBase)._vptr_MultiplexBase = (_func_int **)&PTR_UpdateChannel_00113bf8;
  iVar1 = epoll_create(5);
  this->epollfd_ = iVar1;
  (this->epoll_events_).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->epoll_events_).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->epoll_events_).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  peVar2 = (pointer)operator_new(0x4b0);
  (this->epoll_events_).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
  super__Vector_impl_data._M_start = peVar2;
  (this->epoll_events_).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
  super__Vector_impl_data._M_finish = peVar2;
  (this->epoll_events_).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = peVar2 + 100;
  *(undefined4 *)((long)&peVar2->data + 4) = 0;
  *(undefined8 *)peVar2 = 0;
  lVar3 = 0xc;
  do {
    *(undefined4 *)((long)&peVar2->data + lVar3 + 4) = *(undefined4 *)((long)&peVar2->data + 4);
    *(undefined8 *)((long)&peVar2->events + lVar3) = *(undefined8 *)peVar2;
    lVar3 = lVar3 + 0xc;
  } while (lVar3 != 0x4b0);
  (this->epoll_events_).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
  super__Vector_impl_data._M_finish = peVar2 + 100;
  return;
}

Assistant:

MultiplexEpoll::MultiplexEpoll():
		epollfd_(epoll_create(5)),
		epoll_events_(EPOLL_MAX_EVNETS)
{
	
}